

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O3

ostream * operator<<(ostream *co,Vertex *v)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(co,"Vertex ",7);
  plVar1 = (long *)std::ostream::operator<<((ostream *)co,v->m_id);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return co;
}

Assistant:

std::ostream & operator << ( std::ostream & co, const Vertex & v)
{
    co << "Vertex " << v.id() << std::endl;
    return co;
}